

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void net_addr_str(NETADDR *addr,char *string,int max_length,int add_port)

{
  int in_ECX;
  uint in_EDX;
  char *in_RSI;
  uint *in_RDI;
  
  if (*in_RDI == 1) {
    if (in_ECX == 0) {
      str_format(in_RSI,(int)(ulong)in_EDX,"%d.%d.%d.%d",(ulong)(byte)in_RDI[1],
                 (ulong)*(byte *)((long)in_RDI + 5),(ulong)*(byte *)((long)in_RDI + 6),
                 (uint)*(byte *)((long)in_RDI + 7));
    }
    else {
      str_format(in_RSI,(int)(ulong)in_EDX,"%d.%d.%d.%d:%d",(ulong)(byte)in_RDI[1],
                 (ulong)*(byte *)((long)in_RDI + 5),(ulong)*(byte *)((long)in_RDI + 6),
                 (uint)*(byte *)((long)in_RDI + 7),(uint)(ushort)in_RDI[5]);
    }
  }
  else if (*in_RDI == 2) {
    if (in_ECX == 0) {
      str_format(in_RSI,(int)(ulong)in_EDX,"[%x:%x:%x:%x:%x:%x:%x:%x]",
                 (ulong)CONCAT11((char)in_RDI[1],*(undefined1 *)((long)in_RDI + 5)),
                 (ulong)CONCAT11(*(undefined1 *)((long)in_RDI + 6),*(undefined1 *)((long)in_RDI + 7)
                                ),(ulong)CONCAT11((char)in_RDI[2],*(undefined1 *)((long)in_RDI + 9))
                 ,(uint)CONCAT11(*(undefined1 *)((long)in_RDI + 10),
                                 *(undefined1 *)((long)in_RDI + 0xb)),
                 (uint)CONCAT11((char)in_RDI[3],*(undefined1 *)((long)in_RDI + 0xd)),
                 (uint)CONCAT11(*(undefined1 *)((long)in_RDI + 0xe),
                                *(undefined1 *)((long)in_RDI + 0xf)),
                 (uint)CONCAT11((char)in_RDI[4],*(undefined1 *)((long)in_RDI + 0x11)),
                 (uint)CONCAT11(*(undefined1 *)((long)in_RDI + 0x12),
                                *(undefined1 *)((long)in_RDI + 0x13)));
    }
    else {
      str_format(in_RSI,(int)(ulong)in_EDX,"[%x:%x:%x:%x:%x:%x:%x:%x]:%d",
                 (ulong)CONCAT11((char)in_RDI[1],*(undefined1 *)((long)in_RDI + 5)),
                 (ulong)CONCAT11(*(undefined1 *)((long)in_RDI + 6),*(undefined1 *)((long)in_RDI + 7)
                                ),(ulong)CONCAT11((char)in_RDI[2],*(undefined1 *)((long)in_RDI + 9))
                 ,(uint)CONCAT11(*(undefined1 *)((long)in_RDI + 10),
                                 *(undefined1 *)((long)in_RDI + 0xb)),
                 (uint)CONCAT11((char)in_RDI[3],*(undefined1 *)((long)in_RDI + 0xd)),
                 (uint)CONCAT11(*(undefined1 *)((long)in_RDI + 0xe),
                                *(undefined1 *)((long)in_RDI + 0xf)),
                 (uint)CONCAT11((char)in_RDI[4],*(undefined1 *)((long)in_RDI + 0x11)),
                 (uint)CONCAT11(*(undefined1 *)((long)in_RDI + 0x12),
                                *(undefined1 *)((long)in_RDI + 0x13)),(uint)(ushort)in_RDI[5]);
    }
  }
  else {
    str_format(in_RSI,(int)(ulong)in_EDX,"unknown type %d",(ulong)*in_RDI);
  }
  return;
}

Assistant:

void net_addr_str(const NETADDR *addr, char *string, int max_length, int add_port)
{
	if(addr->type == NETTYPE_IPV4)
	{
		if(add_port != 0)
			str_format(string, max_length, "%d.%d.%d.%d:%d", addr->ip[0], addr->ip[1], addr->ip[2], addr->ip[3], addr->port);
		else
			str_format(string, max_length, "%d.%d.%d.%d", addr->ip[0], addr->ip[1], addr->ip[2], addr->ip[3]);
	}
	else if(addr->type == NETTYPE_IPV6)
	{
		if(add_port != 0)
			str_format(string, max_length, "[%x:%x:%x:%x:%x:%x:%x:%x]:%d",
				(addr->ip[0]<<8)|addr->ip[1], (addr->ip[2]<<8)|addr->ip[3], (addr->ip[4]<<8)|addr->ip[5], (addr->ip[6]<<8)|addr->ip[7],
				(addr->ip[8]<<8)|addr->ip[9], (addr->ip[10]<<8)|addr->ip[11], (addr->ip[12]<<8)|addr->ip[13], (addr->ip[14]<<8)|addr->ip[15],
				addr->port);
		else
			str_format(string, max_length, "[%x:%x:%x:%x:%x:%x:%x:%x]",
				(addr->ip[0]<<8)|addr->ip[1], (addr->ip[2]<<8)|addr->ip[3], (addr->ip[4]<<8)|addr->ip[5], (addr->ip[6]<<8)|addr->ip[7],
				(addr->ip[8]<<8)|addr->ip[9], (addr->ip[10]<<8)|addr->ip[11], (addr->ip[12]<<8)|addr->ip[13], (addr->ip[14]<<8)|addr->ip[15]);
	}
	else
		str_format(string, max_length, "unknown type %d", addr->type);
}